

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_clib.c
# Opt level: O1

TValue * lj_clib_index(lua_State *L,CLibrary *cl,GCstr *name)

{
  CTState *cts;
  GCtab *pGVar1;
  uint64_t uVar2;
  CTypeID CVar3;
  CType *in_RAX;
  GCobj *o;
  TValue *pTVar4;
  long lVar5;
  void *pvVar6;
  lua_Number lVar7;
  CType *ct;
  CType *local_38;
  
  local_38 = in_RAX;
  pTVar4 = lj_tab_setstr(L,cl->cache,name);
  if (pTVar4->u64 == 0xffffffffffffffff) {
    cts = *(CTState **)((L->glref).ptr64 + 0x180);
    cts->L = L;
    CVar3 = lj_ctype_getname(cts,&local_38,name,0x1840);
    if (CVar3 == 0) {
      lj_err_callerv(L,LJ_ERR_FFI_NODECL,name + 1);
    }
    if ((local_38->info & 0xf0000000) == 0xb0000000) {
      if (((cts->tab[(ushort)local_38->info].info & 0x800000) == 0) || (-1 < (int)local_38->size)) {
        lVar7 = (lua_Number)(int)local_38->size;
      }
      else {
        lVar7 = (lua_Number)local_38->size;
      }
      pTVar4->n = lVar7;
    }
    else {
      lVar5 = dlsym(cl->handle);
      if (lVar5 == 0) {
        clib_error_(L);
      }
      pvVar6 = lj_mem_newgco(cts->L,0x18);
      *(undefined1 *)((long)pvVar6 + 9) = 10;
      *(short *)((long)pvVar6 + 10) = (short)CVar3;
      *(long *)((long)pvVar6 + 0x10) = lVar5;
      pTVar4->u64 = (ulong)pvVar6 | 0xfffa800000000000;
      pGVar1 = cl->cache;
      if ((pGVar1->marked & 4) != 0) {
        uVar2 = (L->glref).ptr64;
        pGVar1->marked = pGVar1->marked & 0xfb;
        (pGVar1->gclist).gcptr64 = *(uint64_t *)(uVar2 + 0x40);
        *(GCtab **)(uVar2 + 0x40) = pGVar1;
      }
    }
  }
  return pTVar4;
}

Assistant:

TValue *lj_clib_index(lua_State *L, CLibrary *cl, GCstr *name)
{
  TValue *tv = lj_tab_setstr(L, cl->cache, name);
  if (LJ_UNLIKELY(tvisnil(tv))) {
    CTState *cts = ctype_cts(L);
    CType *ct;
    CTypeID id = lj_ctype_getname(cts, &ct, name, CLNS_INDEX);
    if (!id)
      lj_err_callerv(L, LJ_ERR_FFI_NODECL, strdata(name));
    if (ctype_isconstval(ct->info)) {
      CType *ctt = ctype_child(cts, ct);
      lj_assertCTS(ctype_isinteger(ctt->info) && ctt->size <= 4,
		   "only 32 bit const supported");  /* NYI */
      if ((ctt->info & CTF_UNSIGNED) && (int32_t)ct->size < 0)
	setnumV(tv, (lua_Number)(uint32_t)ct->size);
      else
	setintV(tv, (int32_t)ct->size);
    } else {
      const char *sym = clib_extsym(cts, ct, name);
#if LJ_TARGET_WINDOWS
      DWORD oldwerr = GetLastError();
#endif
      void *p = clib_getsym(cl, sym);
      GCcdata *cd;
      lj_assertCTS(ctype_isfunc(ct->info) || ctype_isextern(ct->info),
		   "unexpected ctype %08x in clib", ct->info);
#if LJ_TARGET_X86 && LJ_ABI_WIN
      /* Retry with decorated name for fastcall/stdcall functions. */
      if (!p && ctype_isfunc(ct->info)) {
	CTInfo cconv = ctype_cconv(ct->info);
	if (cconv == CTCC_FASTCALL || cconv == CTCC_STDCALL) {
	  CTSize sz = clib_func_argsize(cts, ct);
	  const char *symd = lj_strfmt_pushf(L,
			       cconv == CTCC_FASTCALL ? "@%s@%d" : "_%s@%d",
			       sym, sz);
	  L->top--;
	  p = clib_getsym(cl, symd);
	}
      }
#endif
      if (!p)
	clib_error(L, "cannot resolve symbol " LUA_QS ": %s", sym);
#if LJ_TARGET_WINDOWS
      SetLastError(oldwerr);
#endif
      cd = lj_cdata_new(cts, id, CTSIZE_PTR);
      *(void **)cdataptr(cd) = p;
      setcdataV(L, tv, cd);
      lj_gc_anybarriert(L, cl->cache);
    }
  }
  return tv;
}